

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

void __thiscall DPSprite::Destroy(DPSprite *this)

{
  player_t *ppVar1;
  DPSprite *pDVar2;
  DPSprite *pDVar3;
  DPSprite *pDVar4;
  DObject *pointed;
  
  ppVar1 = this->Owner;
  if ((ppVar1 != (player_t *)0x0) &&
     (pDVar2 = (ppVar1->psprites).field_0.p, pDVar2 != (DPSprite *)0x0)) {
    if (((pDVar2->super_DObject).ObjectFlags & 0x20) == 0) {
      pDVar2 = (this->Owner->psprites).field_0.p;
      if ((pDVar2 != (DPSprite *)0x0) && (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0)) {
        (this->Owner->psprites).field_0.p = (DPSprite *)0x0;
        pDVar2 = (DPSprite *)0x0;
      }
      if (pDVar2 == this) {
        (this->Owner->psprites).field_0 = (this->Next).field_0;
        pointed = (this->Next).field_0.o;
        if ((pointed != (DObject *)0x0) && ((pointed->ObjectFlags & 0x20) != 0)) {
          (this->Next).field_0.p = (DPSprite *)0x0;
          pointed = (DObject *)0x0;
        }
        if (((pointed != (DObject *)0x0) && (GC::State == 1)) && ((pointed->ObjectFlags & 3) != 0))
        {
          pDVar2 = (DPSprite *)0x0;
LAB_0052da79:
          GC::Barrier(&pDVar2->super_DObject,pointed);
        }
      }
      else {
        pDVar3 = (this->Owner->psprites).field_0.p;
        if ((pDVar3 != (DPSprite *)0x0) && (((pDVar3->super_DObject).ObjectFlags & 0x20) != 0)) {
          (this->Owner->psprites).field_0.p = (DPSprite *)0x0;
          pDVar3 = (DPSprite *)0x0;
        }
        while (pDVar2 = pDVar3, pDVar2 != (DPSprite *)0x0) {
          pDVar4 = (pDVar2->Next).field_0.p;
          if ((pDVar4 != (DPSprite *)0x0) && (((pDVar4->super_DObject).ObjectFlags & 0x20) != 0)) {
            (pDVar2->Next).field_0.p = (DPSprite *)0x0;
            pDVar4 = (DPSprite *)0x0;
          }
          pDVar3 = (pDVar2->Next).field_0.p;
          if (pDVar4 == this) {
            if ((pDVar3 != (DPSprite *)0x0) && (((pDVar3->super_DObject).ObjectFlags & 0x20) != 0))
            {
              (pDVar2->Next).field_0.p = (DPSprite *)0x0;
              pDVar3 = (DPSprite *)0x0;
            }
            if (pDVar3 == this) {
              (pDVar2->Next).field_0 = (this->Next).field_0;
              pointed = (this->Next).field_0.o;
              if ((pointed != (DObject *)0x0) && ((pointed->ObjectFlags & 0x20) != 0)) {
                (this->Next).field_0.p = (DPSprite *)0x0;
                pointed = (DObject *)0x0;
              }
              if (((pointed != (DObject *)0x0) && ((pointed->ObjectFlags & 3) != 0)) &&
                 (((pDVar2->super_DObject).ObjectFlags & 4) != 0)) goto LAB_0052da79;
            }
            break;
          }
          if ((pDVar3 != (DPSprite *)0x0) && (((pDVar3->super_DObject).ObjectFlags & 0x20) != 0)) {
            (pDVar2->Next).field_0.p = (DPSprite *)0x0;
            pDVar3 = (DPSprite *)0x0;
          }
        }
      }
    }
    else {
      (ppVar1->psprites).field_0.p = (DPSprite *)0x0;
    }
  }
  DObject::Destroy(&this->super_DObject);
  return;
}

Assistant:

void DPSprite::Destroy()
{
	// Do not crash if this gets called on partially initialized objects.
	if (Owner != nullptr && Owner->psprites != nullptr)
	{
		if (Owner->psprites != this)
		{
			DPSprite *prev = Owner->psprites;
			while (prev != nullptr && prev->Next != this)
				prev = prev->Next;

			if (prev != nullptr && prev->Next == this)
			{
				prev->Next = Next;
				GC::WriteBarrier(prev, Next);
			}
		}
		else
		{
			Owner->psprites = Next;
			GC::WriteBarrier(Next);
		}
	}
	Super::Destroy();
}